

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O3

void canvas_selectall(_glist *x)

{
  int iVar1;
  t_selection *ptVar2;
  t_gobj *y;
  
  if (x->gl_editor != (t_editor *)0x0) {
    if ((x->field_0xe8 & 0x20) == 0) {
      canvas_editmode(x,1.0);
    }
    iVar1 = glist_selectionindex(x,(t_gobj *)0x0,0);
    if (iVar1 == 0) {
      glist_noselect(x);
      return;
    }
    for (y = x->gl_list; y != (t_gobj *)0x0; y = y->g_next) {
      if (x->gl_editor != (t_editor *)0x0) {
        for (ptVar2 = x->gl_editor->e_selection; ptVar2 != (t_selection *)0x0;
            ptVar2 = ptVar2->sel_next) {
          if (ptVar2->sel_what == y) goto LAB_001432e7;
        }
      }
      glist_select(x,y);
LAB_001432e7:
    }
  }
  return;
}

Assistant:

static void canvas_selectall(t_canvas *x)
{
    t_gobj *y;
    if (!x->gl_editor)
        return;
    if (!x->gl_edit)
        canvas_editmode(x, 1);
        /* if everyone is already selected deselect everyone */
    if (!glist_selectionindex(x, 0, 0))
        glist_noselect(x);
    else for (y = x->gl_list; y; y = y->g_next)
         {
             if (!glist_isselected(x, y))
                 glist_select(x, y);
         }
}